

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O1

MPP_RET kmpp_cfg_init(MpiEncMultiCtxInfo *info)

{
  MPP_RET MVar1;
  MppVencKcfg init_kcfg;
  MppVencKcfg local_18;
  
  local_18 = (MppVencKcfg)0x0;
  mpp_venc_kcfg_init(&local_18,0);
  if (local_18 == (MppVencKcfg)0x0) {
    MVar1 = _mpp_log_l(2,"mpi_enc_test","kmpp_venc_init_cfg_init failed\n","kmpp_cfg_init");
  }
  else {
    (info->ctx).init_kcfg = local_18;
    mpp_venc_kcfg_set_u32(local_18,"type",1);
    mpp_venc_kcfg_set_u32(local_18,"coding",(info->ctx).type);
    mpp_venc_kcfg_set_s32(local_18,"chan_id",0);
    mpp_venc_kcfg_set_s32(local_18,"online",0);
    mpp_venc_kcfg_set_u32(local_18,"buf_size",0);
    mpp_venc_kcfg_set_u32(local_18,"max_strm_cnt",0);
    mpp_venc_kcfg_set_u32(local_18,"shared_buf_en",0);
    mpp_venc_kcfg_set_u32(local_18,"smart_en",0);
    mpp_venc_kcfg_set_u32(local_18,"max_width",(info->ctx).width);
    mpp_venc_kcfg_set_u32(local_18,"max_height",(info->ctx).height);
    mpp_venc_kcfg_set_u32(local_18,"max_lt_cnt",0);
    mpp_venc_kcfg_set_u32(local_18,"qpmap_en",0);
    mpp_venc_kcfg_set_u32(local_18,"chan_dup",0);
    mpp_venc_kcfg_set_u32(local_18,"tmvp_enable",0);
    mpp_venc_kcfg_set_u32(local_18,"only_smartp",0);
    MVar1 = (*((info->ctx).mpi)->control)((info->ctx).ctx,MPP_SET_VENC_INIT_KCFG,local_18);
    if (MVar1 != MPP_OK) {
      MVar1 = _mpp_log_l(2,"mpi_enc_test","mpi control set kmpp enc cfg failed ret %d\n",
                         "kmpp_cfg_init",MVar1);
    }
  }
  return MVar1;
}

Assistant:

static MPP_RET kmpp_cfg_init(MpiEncMultiCtxInfo *info)
{
    MppVencKcfg init_kcfg = NULL;
    MpiEncTestData *p = &info->ctx;
    MPP_RET ret = MPP_NOK;

    mpp_venc_kcfg_init(&init_kcfg, MPP_VENC_KCFG_TYPE_INIT);
    if (!init_kcfg) {
        mpp_err_f("kmpp_venc_init_cfg_init failed\n");
        return ret;
    }

    p->init_kcfg = init_kcfg;

    mpp_venc_kcfg_set_u32(init_kcfg, "type", MPP_CTX_ENC);
    mpp_venc_kcfg_set_u32(init_kcfg, "coding", p->type);
    mpp_venc_kcfg_set_s32(init_kcfg, "chan_id", 0);
    mpp_venc_kcfg_set_s32(init_kcfg, "online", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "buf_size", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "max_strm_cnt", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "shared_buf_en", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "smart_en", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "max_width", p->width);
    mpp_venc_kcfg_set_u32(init_kcfg, "max_height", p->height);
    mpp_venc_kcfg_set_u32(init_kcfg, "max_lt_cnt", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "qpmap_en", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "chan_dup", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "tmvp_enable", 0);
    mpp_venc_kcfg_set_u32(init_kcfg, "only_smartp", 0);

    ret = p->mpi->control(p->ctx, MPP_SET_VENC_INIT_KCFG, init_kcfg);
    if (ret)
        mpp_err_f("mpi control set kmpp enc cfg failed ret %d\n", ret);

    return ret;
}